

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcValue::assertArrayConst(XmlRpcValue *this,int size)

{
  string *message;
  size_type sVar1;
  undefined8 uVar2;
  int in_ESI;
  int *in_RDI;
  undefined8 in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  XmlRpcException *in_stack_ffffffffffffff80;
  XmlRpcException *this_00;
  undefined1 local_69 [9];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_31 [49];
  
  if (*in_RDI != 7) {
    message = (string *)__cxa_allocate_exception(0x28);
    this_00 = (XmlRpcException *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    XmlRpcException::XmlRpcException
              (this_00,message,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    __cxa_throw(message,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  local_31._37_4_ = in_ESI;
  sVar1 = std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::size
                    (*(vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> **)
                      (in_RDI + 2));
  if ((int)sVar1 < (int)local_31._37_4_) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    XmlRpcException::XmlRpcException
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(int)((ulong)local_69 >> 0x20));
    __cxa_throw(uVar2,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertArrayConst(int size) const
  {
    if (_type != TypeArray)
      throw XmlRpcException("type error: expected an array");
    else if (int(_value.asArray->size()) < size)
      throw XmlRpcException("range error: array index too large");
  }